

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_view_relation.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::CreateViewRelation::Bind
          (BoundStatement *__return_storage_ptr__,CreateViewRelation *this,Binder *binder)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var4;
  _func_int **pp_Var5;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> uVar6;
  Relation *pRVar7;
  pointer pSVar8;
  CreateViewInfo *this_00;
  pointer pCVar9;
  pointer *__ptr;
  templated_unique_single_t info;
  templated_unique_single_t select;
  CreateStatement stmt;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_b8;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_b0;
  CreateStatement local_a8;
  
  local_b0._M_head_impl = (SelectStatement *)operator_new(0x80);
  ((local_b0._M_head_impl)->super_SQLStatement).type = SELECT_STATEMENT;
  ((local_b0._M_head_impl)->super_SQLStatement).stmt_location = 0;
  ((local_b0._M_head_impl)->super_SQLStatement).stmt_length = 0;
  ((local_b0._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_buckets =
       &((local_b0._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket;
  ((local_b0._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
  ((local_b0._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  ((local_b0._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
  ((local_b0._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  ((local_b0._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize
       = 0;
  ((local_b0._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  ((local_b0._M_head_impl)->super_SQLStatement).query._M_dataplus._M_p =
       (pointer)&((local_b0._M_head_impl)->super_SQLStatement).query.field_2;
  ((local_b0._M_head_impl)->super_SQLStatement).query._M_string_length = 0;
  ((local_b0._M_head_impl)->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
  ((local_b0._M_head_impl)->super_SQLStatement)._vptr_SQLStatement =
       (_func_int **)&PTR__SelectStatement_02492f28;
  ((local_b0._M_head_impl)->node).
  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  pRVar7 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar7->_vptr_Relation[3])(&local_a8,pRVar7);
  pSVar8 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)&local_b0);
  pp_Var5 = local_a8.super_SQLStatement._vptr_SQLStatement;
  local_a8.super_SQLStatement._vptr_SQLStatement = (_func_int **)0x0;
  _Var2._M_head_impl =
       (pSVar8->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar8->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)pp_Var5;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
  }
  if (local_a8.super_SQLStatement._vptr_SQLStatement != (_func_int **)0x0) {
    (**(code **)(*local_a8.super_SQLStatement._vptr_SQLStatement + 8))();
  }
  CreateStatement::CreateStatement(&local_a8);
  this_00 = (CreateViewInfo *)operator_new(0x1b0);
  CreateViewInfo::CreateViewInfo(this_00);
  local_b8._M_head_impl = (CreateInfo *)this_00;
  pCVar9 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_b8);
  _Var4._M_head_impl = local_b0._M_head_impl;
  local_b0._M_head_impl = (SelectStatement *)0x0;
  _Var3._M_head_impl =
       (pCVar9->query).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pCVar9->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_SQLStatement + 8))();
  }
  pCVar9 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_b8);
  ::std::__cxx11::string::_M_assign((string *)&pCVar9->view_name);
  bVar1 = this->temporary;
  pCVar9 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_b8);
  (pCVar9->super_CreateInfo).temporary = bVar1;
  pCVar9 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_b8);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar9->super_CreateInfo).schema);
  bVar1 = this->replace;
  pCVar9 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_b8);
  uVar6.super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)local_a8.info;
  local_a8.info.super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       local_b8._M_head_impl;
  (pCVar9->super_CreateInfo).on_conflict = bVar1 * '\x02';
  local_b8._M_head_impl = (CreateInfo *)0x0;
  if (uVar6.super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true,_true>)0x0)
  {
    (**(code **)(*(long *)uVar6.
                          super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                          .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl + 8))();
  }
  Binder::Bind(__return_storage_ptr__,binder,&local_a8.super_SQLStatement);
  if (local_b8._M_head_impl != (CreateInfo *)0x0) {
    (*((local_b8._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_a8.super_SQLStatement._vptr_SQLStatement = (_func_int **)&PTR__CreateStatement_02492c88;
  if (local_a8.info.super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
      _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true,_true>)0x0)
  {
    (**(code **)(*(long *)local_a8.info.
                          super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                          .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl + 8))();
  }
  local_a8.info.super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       (__uniq_ptr_data<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true,_true>)0x0
  ;
  SQLStatement::~SQLStatement(&local_a8.super_SQLStatement);
  if (local_b0._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)((long)((local_b0._M_head_impl)->super_SQLStatement)._vptr_SQLStatement + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement CreateViewRelation::Bind(Binder &binder) {
	auto select = make_uniq<SelectStatement>();
	select->node = child->GetQueryNode();

	CreateStatement stmt;
	auto info = make_uniq<CreateViewInfo>();
	info->query = std::move(select);
	info->view_name = view_name;
	info->temporary = temporary;
	info->schema = schema_name;
	info->on_conflict = replace ? OnCreateConflict::REPLACE_ON_CONFLICT : OnCreateConflict::ERROR_ON_CONFLICT;
	stmt.info = std::move(info);
	return binder.Bind(stmt.Cast<SQLStatement>());
}